

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O3

void __thiscall
icu_63::CollationRuleParser::parseRelationStrings
          (CollationRuleParser *this,int32_t strength,int32_t i,UErrorCode *errorCode)

{
  short sVar1;
  UnicodeString *pUVar2;
  char16_t cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  char16_t *pcVar8;
  UnicodeString prefix;
  UnicodeString str;
  UnicodeString extension;
  UnicodeString local_f0;
  UnicodeString local_b0;
  UnicodeString local_70;
  
  local_f0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_f0.fUnion.fStackFields.fLengthAndFlags = 2;
  local_b0.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_b0.fUnion.fStackFields.fLengthAndFlags = 2;
  local_70.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_003b2258;
  local_70.fUnion.fStackFields.fLengthAndFlags = 2;
  uVar4 = parseTailoringString(this,i,&local_b0,errorCode);
  if (U_ZERO_ERROR < *errorCode) goto LAB_00235256;
  pUVar2 = this->rules;
  sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar5 = (pUVar2->fUnion).fFields.fLength;
  }
  else {
    uVar5 = (int)sVar1 >> 5;
  }
  if (uVar4 < uVar5 && (int)uVar4 < (int)uVar5) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar8 = (pUVar2->fUnion).fFields.fArray;
    }
    else {
      pcVar8 = (char16_t *)((long)&pUVar2->fUnion + 2);
    }
    cVar3 = pcVar8[(int)uVar4];
    if (cVar3 == L'|') {
      UnicodeString::operator=(&local_f0,&local_b0);
      uVar4 = parseTailoringString(this,uVar4 + 1,&local_b0,errorCode);
      if (U_ZERO_ERROR < *errorCode) goto LAB_00235256;
      pUVar2 = this->rules;
      sVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        uVar5 = (pUVar2->fUnion).fFields.fLength;
      }
      else {
        uVar5 = (int)sVar1 >> 5;
      }
      if (uVar5 <= uVar4 || (int)uVar5 <= (int)uVar4) goto LAB_002351aa;
      if (((int)sVar1 & 2U) == 0) {
        pcVar8 = (pUVar2->fUnion).fFields.fArray;
      }
      else {
        pcVar8 = (char16_t *)((long)&pUVar2->fUnion + 2);
      }
      cVar3 = pcVar8[(int)uVar4];
    }
    if (cVar3 == L'/') {
      uVar4 = parseTailoringString(this,uVar4 + 1,&local_70,errorCode);
    }
  }
LAB_002351aa:
  if ((ushort)local_f0.fUnion.fStackFields.fLengthAndFlags < 0x20) {
LAB_002351f2:
    (*(this->sink->super_UObject)._vptr_UObject[4])
              (this->sink,strength,&local_f0,&local_b0,&local_70,&this->errorReason,errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      setErrorContext(this);
    }
    this->ruleIndex = uVar4;
  }
  else {
    uVar5 = UnicodeString::char32At(&local_f0,0);
    uVar6 = UnicodeString::char32At(&local_b0,0);
    iVar7 = (*(this->nfc->super_UObject)._vptr_UObject[0xf])(this->nfc,(ulong)uVar5);
    if ((char)iVar7 != '\0') {
      iVar7 = (*(this->nfc->super_UObject)._vptr_UObject[0xf])(this->nfc,(ulong)uVar6);
      if ((char)iVar7 != '\0') goto LAB_002351f2;
    }
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      *errorCode = U_INVALID_FORMAT_ERROR;
      this->errorReason = "in \'prefix|str\', prefix and str must each start with an NFC boundary";
      if (this->parseError != (UParseError *)0x0) {
        setErrorContext(this);
      }
    }
  }
LAB_00235256:
  UnicodeString::~UnicodeString(&local_70);
  UnicodeString::~UnicodeString(&local_b0);
  UnicodeString::~UnicodeString(&local_f0);
  return;
}

Assistant:

void
CollationRuleParser::parseRelationStrings(int32_t strength, int32_t i, UErrorCode &errorCode) {
    // Parse
    //     prefix | str / extension
    // where prefix and extension are optional.
    UnicodeString prefix, str, extension;
    i = parseTailoringString(i, str, errorCode);
    if(U_FAILURE(errorCode)) { return; }
    UChar next = (i < rules->length()) ? rules->charAt(i) : 0;
    if(next == 0x7c) {  // '|' separates the context prefix from the string.
        prefix = str;
        i = parseTailoringString(i + 1, str, errorCode);
        if(U_FAILURE(errorCode)) { return; }
        next = (i < rules->length()) ? rules->charAt(i) : 0;
    }
    if(next == 0x2f) {  // '/' separates the string from the extension.
        i = parseTailoringString(i + 1, extension, errorCode);
    }
    if(!prefix.isEmpty()) {
        UChar32 prefix0 = prefix.char32At(0);
        UChar32 c = str.char32At(0);
        if(!nfc.hasBoundaryBefore(prefix0) || !nfc.hasBoundaryBefore(c)) {
            setParseError("in 'prefix|str', prefix and str must each start with an NFC boundary",
                          errorCode);
            return;
        }
    }
    sink->addRelation(strength, prefix, str, extension, errorReason, errorCode);
    if(U_FAILURE(errorCode)) { setErrorContext(); }
    ruleIndex = i;
}